

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

xmlBufPtr xmlBufCreate(void)

{
  xmlBufPtr pxVar1;
  int *piVar2;
  uint *puVar3;
  xmlBufferAllocationScheme *pxVar4;
  xmlChar *pxVar5;
  
  pxVar1 = (xmlBufPtr)(*xmlMalloc)(0x40);
  if (pxVar1 == (xmlBufPtr)0x0) {
    pxVar1 = (xmlBufPtr)0x0;
    __xmlSimpleError(0x1d,2,(xmlNodePtr)0x0,(char *)0x0,"creating buffer");
  }
  else {
    pxVar1->compat_use = 0;
    pxVar1->use = 0;
    pxVar1->error = 0;
    pxVar1->buffer = (xmlBufferPtr)0x0;
    piVar2 = __xmlDefaultBufferSize();
    pxVar1->size = (long)*piVar2;
    puVar3 = (uint *)__xmlDefaultBufferSize();
    pxVar1->compat_size = *puVar3;
    pxVar4 = __xmlBufferAllocScheme();
    pxVar1->alloc = *pxVar4;
    pxVar5 = (xmlChar *)(*xmlMallocAtomic)(pxVar1->size);
    pxVar1->content = pxVar5;
    if (pxVar5 == (xmlChar *)0x0) {
      __xmlSimpleError(0x1d,2,(xmlNodePtr)0x0,(char *)0x0,"creating buffer");
      if (pxVar1->error == 0) {
        pxVar1->error = 2;
      }
      (*xmlFree)(pxVar1);
      pxVar1 = (xmlBufPtr)0x0;
    }
    else {
      *pxVar5 = '\0';
      pxVar1->contentIO = (xmlChar *)0x0;
    }
  }
  return pxVar1;
}

Assistant:

xmlBufPtr
xmlBufCreate(void) {
    xmlBufPtr ret;

    ret = (xmlBufPtr) xmlMalloc(sizeof(xmlBuf));
    if (ret == NULL) {
	xmlBufMemoryError(NULL, "creating buffer");
        return(NULL);
    }
    ret->compat_use = 0;
    ret->use = 0;
    ret->error = 0;
    ret->buffer = NULL;
    ret->size = xmlDefaultBufferSize;
    ret->compat_size = xmlDefaultBufferSize;
    ret->alloc = xmlBufferAllocScheme;
    ret->content = (xmlChar *) xmlMallocAtomic(ret->size * sizeof(xmlChar));
    if (ret->content == NULL) {
	xmlBufMemoryError(ret, "creating buffer");
	xmlFree(ret);
        return(NULL);
    }
    ret->content[0] = 0;
    ret->contentIO = NULL;
    return(ret);
}